

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_optimizations.cpp
# Opt level: O1

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::RegexOptimizationRule::Apply
          (RegexOptimizationRule *this,LogicalOperator *op,
          vector<std::reference_wrapper<duckdb::Expression>,_true> *bindings,bool *changes_made,
          bool is_root)

{
  _Head_base<0UL,_duckdb::FunctionData_*,_false> _Var1;
  pointer pcVar2;
  pointer puVar3;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var4;
  _func_int **pp_Var5;
  int iVar6;
  reference pvVar7;
  BoundFunctionExpression *pBVar8;
  BoundConstantExpression *pBVar9;
  ClientContext *context;
  string *psVar10;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var11;
  pointer pBVar12;
  reference pvVar13;
  pointer *__ptr;
  templated_unique_single_t parameter;
  LikeString like_string;
  templated_unique_single_t like_expression;
  string patt_str;
  RegexpMatchesBindData regexp_bind_data;
  Options parsed_options;
  RE2 pattern;
  Value constant_value;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_3f0;
  _Alloc_hider local_3e8;
  size_type local_3e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  undefined1 local_3c8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3c0;
  size_type local_3b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0;
  _func_int **local_3a0 [8];
  string local_360;
  string local_340;
  LogicalType local_320;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_308;
  element_type *peStack_300;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> local_2f8 [2];
  undefined1 local_2e8 [32];
  _Alloc_hider local_2c8;
  char local_2b8 [16];
  bool local_2a8;
  undefined1 *local_2a0 [2];
  undefined1 local_290 [16];
  undefined1 *local_280 [2];
  undefined1 local_270 [16];
  undefined1 local_260;
  undefined1 local_258 [32];
  undefined8 local_238;
  undefined1 local_230 [8];
  _Alloc_hider _Stack_228;
  element_type local_218 [2];
  _Any_data local_180;
  _Manager_type local_170;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_110;
  undefined1 local_108 [68];
  uint local_c4;
  Value local_70;
  
  pvVar7 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[]
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,0);
  pBVar8 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                     (&pvVar7->_M_data->super_BaseExpression);
  pvVar7 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[]
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,2);
  pBVar9 = BaseExpression::Cast<duckdb::BoundConstantExpression>
                     (&pvVar7->_M_data->super_BaseExpression);
  _Var1._M_head_impl =
       (pBVar8->bind_info).
       super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
       super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
       super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
  local_2e8._0_8_ = &PTR__RegexpBaseBindData_0247fb28;
  local_2e8._8_4_ = *(undefined4 *)&_Var1._M_head_impl[1]._vptr_FunctionData;
  local_2e8._12_4_ = *(undefined4 *)((long)&_Var1._M_head_impl[1]._vptr_FunctionData + 4);
  local_2e8._16_4_ = *(undefined4 *)&_Var1._M_head_impl[2]._vptr_FunctionData;
  local_2e8._20_4_ = *(undefined4 *)((long)&_Var1._M_head_impl[2]._vptr_FunctionData + 4);
  local_2e8._24_8_ = _Var1._M_head_impl[3]._vptr_FunctionData;
  local_2c8._M_p = local_2b8;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2c8,_Var1._M_head_impl[4]._vptr_FunctionData,
             (long)_Var1._M_head_impl[5]._vptr_FunctionData +
             (long)_Var1._M_head_impl[4]._vptr_FunctionData);
  local_2a8 = *(bool *)&_Var1._M_head_impl[8]._vptr_FunctionData;
  local_2e8._0_8_ = &PTR__RegexpMatchesBindData_0247fb58;
  local_2a0[0] = local_290;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_2a0,_Var1._M_head_impl[9]._vptr_FunctionData,
             (long)_Var1._M_head_impl[10]._vptr_FunctionData +
             (long)_Var1._M_head_impl[9]._vptr_FunctionData);
  local_280[0] = local_270;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_280,_Var1._M_head_impl[0xd]._vptr_FunctionData,
             (long)_Var1._M_head_impl[0xe]._vptr_FunctionData +
             (long)_Var1._M_head_impl[0xd]._vptr_FunctionData);
  local_260 = *(undefined1 *)&_Var1._M_head_impl[0x11]._vptr_FunctionData;
  context = Rule::GetContext((Rule *)op);
  ExpressionExecutor::EvaluateScalar(&local_70,context,&pBVar9->super_Expression,false);
  local_258._16_8_ = local_2e8._24_8_;
  local_258._0_8_ = CONCAT44(local_2e8._12_4_,local_2e8._8_4_);
  local_258._12_4_ = local_2e8._20_4_;
  local_258._8_4_ = local_2e8._16_4_;
  if ((pBVar9->value).is_null == true) {
    LogicalType::LogicalType(&local_320,&(pBVar8->super_Expression).return_type);
    Value::Value((Value *)local_108,&local_320);
    pBVar9 = (BoundConstantExpression *)operator_new(0x98);
    Value::Value((Value *)local_230,(Value *)local_108);
    BoundConstantExpression::BoundConstantExpression(pBVar9,(Value *)local_230);
    Value::~Value((Value *)local_230);
    (this->super_Rule)._vptr_Rule = (_func_int **)pBVar9;
    Value::~Value((Value *)local_108);
    LogicalType::~LogicalType(&local_320);
  }
  else {
    psVar10 = StringValue::Get_abi_cxx11_(&local_70);
    pcVar2 = (psVar10->_M_dataplus)._M_p;
    local_308 = local_2f8;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_308,pcVar2,pcVar2 + psVar10->_M_string_length);
    iVar6 = (*(pBVar9->super_Expression).super_BaseExpression._vptr_BaseExpression[0xf])(pBVar9);
    if ((char)iVar6 == '\0') {
      (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
    }
    else {
      local_230 = (undefined1  [8])local_308;
      _Stack_228._M_p = (pointer)peStack_300;
      duckdb_re2::RE2::RE2((RE2 *)local_108,(StringPiece *)local_230,(Options *)local_258);
      if ((local_c4 & 0x1fffffff) == 0) {
        local_3c8[0] = true;
        local_3c8[1] = false;
        local_3b8 = 0;
        local_3b0._M_local_buf[0] = '\0';
        local_3c0 = &local_3b0;
        if (*(byte *)local_108._32_8_ - 3 < 2) {
          GetLikeStringEscaped((LikeString *)&local_3f0,(Regexp *)local_108._32_8_,true);
          if (local_3f0._M_head_impl._0_1_ == (duckdb)0x0) {
            (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
          }
          else {
            local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3e8._M_p == &local_3d8) {
              local_360.field_2._8_8_ = local_3d8._8_8_;
            }
            else {
              local_360._M_dataplus._M_p = local_3e8._M_p;
            }
            local_360._M_string_length = local_3e0;
            local_3e0 = 0;
            local_3d8._M_local_buf[0] = '\0';
            local_3e8._M_p = (pointer)&local_3d8;
            Value::Value((Value *)local_3a0,&local_360);
            _Var11._M_head_impl = (Expression *)operator_new(0x98);
            Value::Value((Value *)local_230,(Value *)local_3a0);
            BoundConstantExpression::BoundConstantExpression
                      ((BoundConstantExpression *)_Var11._M_head_impl,(Value *)local_230);
            Value::~Value((Value *)local_230);
            Value::~Value((Value *)local_3a0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p != &local_360.field_2) {
              operator_delete(local_360._M_dataplus._M_p);
            }
            GetStringContains();
            local_238 = 0;
            make_uniq<duckdb::BoundFunctionExpression,duckdb::LogicalType&,duckdb::ScalarFunction,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,decltype(nullptr)>
                      ((LogicalType *)local_3a0,
                       (ScalarFunction *)&(pBVar8->super_Expression).return_type,
                       (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                        *)local_230,(void **)&pBVar8->children);
            local_230 = (undefined1  [8])&PTR__ScalarFunction_02476950;
            if (local_110._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_110._M_pi);
            }
            if (local_170 != (_Manager_type)0x0) {
              (*local_170)(&local_180,&local_180,__destroy_functor);
            }
            BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_230);
            pBVar12 = unique_ptr<duckdb::BoundFunctionExpression,_std::default_delete<duckdb::BoundFunctionExpression>,_true>
                      ::operator->((unique_ptr<duckdb::BoundFunctionExpression,_std::default_delete<duckdb::BoundFunctionExpression>,_true>
                                    *)local_3a0);
            pvVar13 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                      ::operator[](&pBVar12->children,1);
            _Var4._M_head_impl =
                 (pvVar13->
                 super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
                 _M_t.
                 super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                 .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
            (pvVar13->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var11._M_head_impl;
            if (_Var4._M_head_impl != (Expression *)0x0) {
              (**(code **)(*(long *)&(_Var4._M_head_impl)->super_BaseExpression + 8))();
            }
            pp_Var5 = local_3a0[0];
            local_3a0[0] = (_func_int **)0x0;
            (this->super_Rule)._vptr_Rule = pp_Var5;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._M_p != &local_3d8) {
            operator_delete(local_3e8._M_p);
          }
        }
        else {
          if (*(byte *)local_108._32_8_ == 5) {
            LikeMatchFromRegex((LikeString *)local_230,(RE2 *)local_108);
            local_3c8._0_2_ = local_230._0_2_;
            ::std::__cxx11::string::operator=((string *)&local_3c0,(string *)&_Stack_228);
            if ((element_type *)_Stack_228._M_p != local_218) {
              operator_delete(_Stack_228._M_p);
            }
          }
          else {
            local_3c8[0] = false;
            local_3c8[1] = false;
          }
          if ((bool)local_3c8[0] == false) {
            (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
          }
          else {
            puVar3 = (pBVar8->children).
                     super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if ((long)puVar3 -
                (long)(pBVar8->children).
                      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start == 0x18) {
              (pBVar8->children).
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = puVar3 + -1;
              _Var11._M_head_impl =
                   puVar3[-1].
                   super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                   _M_t.
                   super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                   .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
              if (_Var11._M_head_impl != (Expression *)0x0) {
                (**(code **)(*(long *)&(_Var11._M_head_impl)->super_BaseExpression + 8))();
              }
              puVar3[-1].
              super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
              super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
              _M_t.
              super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
              .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
            }
            LikeFun::GetFunction();
            local_3f0._M_head_impl = (Expression *)0x0;
            make_uniq<duckdb::BoundFunctionExpression,duckdb::LogicalType&,duckdb::ScalarFunction,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,decltype(nullptr)>
                      ((LogicalType *)local_3a0,
                       (ScalarFunction *)&(pBVar8->super_Expression).return_type,
                       (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                        *)local_230,(void **)&pBVar8->children);
            ScalarFunction::~ScalarFunction((ScalarFunction *)local_230);
            if (local_3c0 == &local_3b0) {
              local_340.field_2._8_8_ = local_3b0._8_8_;
              local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
            }
            else {
              local_340._M_dataplus._M_p = (pointer)local_3c0;
            }
            local_340.field_2._M_allocated_capacity._1_7_ = local_3b0._M_allocated_capacity._1_7_;
            local_340.field_2._M_local_buf[0] = local_3b0._M_local_buf[0];
            local_340._M_string_length = local_3b8;
            local_3b8 = 0;
            local_3b0._M_local_buf[0] = '\0';
            local_3c0 = &local_3b0;
            Value::Value((Value *)local_230,&local_340);
            make_uniq<duckdb::BoundConstantExpression,duckdb::Value>
                      ((duckdb *)&local_3f0,(Value *)local_230);
            Value::~Value((Value *)local_230);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_340._M_dataplus._M_p != &local_340.field_2) {
              operator_delete(local_340._M_dataplus._M_p);
            }
            _Var4._M_head_impl = local_3f0._M_head_impl;
            local_3f0._M_head_impl = (Expression *)0x0;
            pBVar12 = unique_ptr<duckdb::BoundFunctionExpression,_std::default_delete<duckdb::BoundFunctionExpression>,_true>
                      ::operator->((unique_ptr<duckdb::BoundFunctionExpression,_std::default_delete<duckdb::BoundFunctionExpression>,_true>
                                    *)local_3a0);
            pvVar13 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                      ::operator[](&pBVar12->children,1);
            _Var11._M_head_impl =
                 (pvVar13->
                 super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
                 _M_t.
                 super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                 .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
            (pvVar13->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var4._M_head_impl;
            if (_Var11._M_head_impl != (Expression *)0x0) {
              (**(code **)(*(long *)&(_Var11._M_head_impl)->super_BaseExpression + 8))();
            }
            pp_Var5 = local_3a0[0];
            local_3a0[0] = (_func_int **)0x0;
            (this->super_Rule)._vptr_Rule = pp_Var5;
            if (local_3f0._M_head_impl != (Expression *)0x0) {
              (**(code **)(*(long *)local_3f0._M_head_impl + 8))();
            }
            if (local_3a0[0] != (_func_int **)0x0) {
              (**(code **)(*local_3a0[0] + 8))();
            }
          }
        }
        if (local_3c0 != &local_3b0) {
          operator_delete(local_3c0);
        }
      }
      else {
        (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
      }
      duckdb_re2::RE2::~RE2((RE2 *)local_108);
    }
    if (local_308 != local_2f8) {
      operator_delete(local_308);
    }
  }
  Value::~Value(&local_70);
  local_2e8._0_8_ = &PTR__RegexpMatchesBindData_0247fb58;
  if (local_280[0] != local_270) {
    operator_delete(local_280[0]);
  }
  if (local_2a0[0] != local_290) {
    operator_delete(local_2a0[0]);
  }
  RegexpBaseBindData::~RegexpBaseBindData((RegexpBaseBindData *)local_2e8);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> RegexOptimizationRule::Apply(LogicalOperator &op, vector<reference<Expression>> &bindings,
                                                    bool &changes_made, bool is_root) {
	auto &root = bindings[0].get().Cast<BoundFunctionExpression>();
	auto &constant_expr = bindings[2].get().Cast<BoundConstantExpression>();
	D_ASSERT(root.children.size() == 2 || root.children.size() == 3);
	auto regexp_bind_data = root.bind_info.get()->Cast<RegexpMatchesBindData>();

	auto constant_value = ExpressionExecutor::EvaluateScalar(GetContext(), constant_expr);
	D_ASSERT(constant_value.type() == constant_expr.return_type);

	duckdb_re2::RE2::Options parsed_options = regexp_bind_data.options;

	if (constant_expr.value.IsNull()) {
		return make_uniq<BoundConstantExpression>(Value(root.return_type));
	}
	auto patt_str = StringValue::Get(constant_value);

	// the constant_expr is a scalar expression that we have to fold
	if (!constant_expr.IsFoldable()) {
		return nullptr;
	};

	duckdb_re2::RE2 pattern(patt_str, parsed_options);
	if (!pattern.ok()) {
		return nullptr; // this should fail somewhere else
	}

	LikeString like_string;
	// check for a like string. If we can convert it to a like string, the like string
	// optimizer will further optimize suffix and prefix things.
	if (pattern.Regexp()->op() == duckdb_re2::kRegexpLiteralString ||
	    pattern.Regexp()->op() == duckdb_re2::kRegexpLiteral) {
		// convert to contains.
		LikeString escaped_like_string = GetLikeStringEscaped(pattern.Regexp(), true);
		if (!escaped_like_string.exists) {
			return nullptr;
		}
		auto parameter = make_uniq<BoundConstantExpression>(Value(std::move(escaped_like_string.like_string)));
		auto contains = make_uniq<BoundFunctionExpression>(root.return_type, GetStringContains(),
		                                                   std::move(root.children), nullptr);
		contains->children[1] = std::move(parameter);

		return std::move(contains);
	} else if (pattern.Regexp()->op() == duckdb_re2::kRegexpConcat) {
		like_string = LikeMatchFromRegex(pattern);
	} else {
		like_string.exists = false;
	}

	if (!like_string.exists) {
		return nullptr;
	}

	// if regexp had options, remove them so the new Like Expression can be matched for other optimizers.
	if (root.children.size() == 3) {
		root.children.pop_back();
		D_ASSERT(root.children.size() == 2);
	}

	auto like_expression =
	    make_uniq<BoundFunctionExpression>(root.return_type, LikeFun::GetFunction(), std::move(root.children), nullptr);
	auto parameter = make_uniq<BoundConstantExpression>(Value(std::move(like_string.like_string)));
	like_expression->children[1] = std::move(parameter);
	return std::move(like_expression);
}